

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

ItemThing * get_list_item(list<ItemThing_*,_std::allocator<ItemThing_*>_> *l,int i)

{
  bool bVar1;
  reference ppIVar2;
  ItemThing *obj;
  iterator __end1;
  iterator __begin1;
  list<ItemThing_*,_std::allocator<ItemThing_*>_> *__range1;
  int count;
  int i_local;
  list<ItemThing_*,_std::allocator<ItemThing_*>_> *l_local;
  
  __range1._0_4_ = 0;
  __end1 = std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::begin(l);
  obj = (ItemThing *)std::__cxx11::list<ItemThing_*,_std::allocator<ItemThing_*>_>::end(l);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&obj);
    if (!bVar1) {
      return (ItemThing *)0x0;
    }
    ppIVar2 = std::_List_iterator<ItemThing_*>::operator*(&__end1);
    if ((int)__range1 == i) break;
    __range1._0_4_ = (int)__range1 + 1;
    std::_List_iterator<ItemThing_*>::operator++(&__end1);
  }
  return *ppIVar2;
}

Assistant:

static ItemThing* get_list_item(std::list<ItemThing*>& l, int i)
{
    int count = 0;
    for(ItemThing* obj : l)
    {
        if (count == i)
            return obj;
        count++;
    }
    return(nullptr);
}